

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.cpp
# Opt level: O2

void __thiscall pm::Sampler::setupShuffleIndices(Sampler *this)

{
  uint uVar1;
  uint i;
  ulong uVar2;
  uint p;
  long lVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  random_device rd;
  mt19937 g;
  uint local_275c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_2758;
  random_device local_2740;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  std::random_device::random_device(&local_2740);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_13b8,(ulong)uVar1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&this->shuffledIndices_,(ulong)(this->numSets_ * this->numSamples_));
  local_2758._M_impl.super__Vector_impl_data._M_start = (uint *)0x0;
  local_2758._M_impl.super__Vector_impl_data._M_finish = (uint *)0x0;
  local_2758._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2758,
             (ulong)this->numSamples_);
  for (local_275c = 0; local_275c < this->numSamples_; local_275c = local_275c + 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2758,&local_275c);
  }
  for (uVar1 = 0; uVar1 < this->numSets_; uVar1 = uVar1 + 1) {
    std::
    shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
              ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )local_2758._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )local_2758._M_impl.super__Vector_impl_data._M_finish,&local_13b8);
    lVar3 = 0;
    for (uVar2 = 0; uVar2 < this->numSamples_; uVar2 = uVar2 + 1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->shuffledIndices_,
                 (value_type_conflict *)
                 ((long)local_2758._M_impl.super__Vector_impl_data._M_start + lVar3));
      lVar3 = lVar3 + 4;
    }
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_2758);
  std::random_device::~random_device(&local_2740);
  return;
}

Assistant:

void Sampler::setupShuffleIndices()
{
	std::random_device rd;
	std::mt19937 g(rd());

	shuffledIndices_.reserve(numSamples_ * numSets_);
	std::vector<unsigned int> indices;
	indices.reserve(numSamples_);

	for (unsigned int i = 0; i < numSamples_; i++)
		indices.push_back(i);

	for (unsigned int p = 0; p < numSets_; p++)
	{
		std::shuffle(indices.begin(), indices.end(), g);

		for (unsigned int i = 0; i < numSamples_; i++)
			shuffledIndices_.push_back(indices[i]);
	}
}